

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_MNSV_DomThisResolvesWithRespectToSelection_Test::
~InterpreterTestSuite_MNSV_DomThisResolvesWithRespectToSelection_Test
          (InterpreterTestSuite_MNSV_DomThisResolvesWithRespectToSelection_Test *this)

{
  InterpreterTestSuite_MNSV_DomThisResolvesWithRespectToSelection_Test *this_local;
  
  ~InterpreterTestSuite_MNSV_DomThisResolvesWithRespectToSelection_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNSV_DomThisResolvesWithRespectToSelection)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    BorderRouter br;
    br.mNetworkId = NetworkId{0};
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    Interpreter::Expression expr, ret;
    std::vector<uint64_t>   nids;
    expr = ctx.mInterpreter.ParseExpression("start --dom this");
    EXPECT_EQ(ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode(), ErrorCode::kNone);
    EXPECT_TRUE(ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError());
    EXPECT_EQ(nids.size(), 1);
    EXPECT_EQ(nids[0], 1);
}